

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module_ __thiscall pybind11::module_::def_submodule(module_ *this,char *name,char *doc)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 uVar2;
  PyObject *ptr;
  long in_RCX;
  PyObject *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  object in_RDI;
  string full_name;
  module_ *result;
  accessor<pybind11::detail::accessor_policies::str_attr> *this_00;
  object_api<pybind11::handle> *this_01;
  handle this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  handle local_f0;
  undefined1 local_e2;
  undefined1 local_e1 [40];
  object_api<pybind11::handle> local_b9;
  string local_b8 [55];
  undefined1 local_81 [33];
  string local_60 [32];
  string local_40 [32];
  long local_20;
  PyObject *local_18;
  
  this_02 = in_RDI.super_handle.m_ptr;
  local_20 = in_RCX;
  local_18 = in_RDX;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          PyModule_GetName(*(undefined8 *)in_RSI);
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,(char *)__lhs,(allocator<char> *)in_RSI);
  this_01 = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,(char *)__lhs,(allocator<char> *)in_RSI);
  std::operator+(__lhs,in_RSI);
  this_00 = (accessor<pybind11::detail::accessor_policies::str_attr> *)local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,(char *)__lhs,(allocator<char> *)in_RSI);
  std::operator+(__lhs,in_RSI);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  local_e2 = 0;
  uVar2 = std::__cxx11::string::c_str();
  ptr = (PyObject *)PyImport_AddModule(uVar2);
  pybind11::handle::handle(&local_f0,ptr);
  reinterpret_borrow<pybind11::module_>((handle)local_18);
  if ((local_20 != 0) && (bVar1 = options::show_user_defined_docstrings(), bVar1)) {
    str::str((str *)this_02.m_ptr,(char *)this_01);
    detail::object_api<pybind11::handle>::attr(this_01,(char *)this_00);
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (this_00,(str *)local_18);
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x15fd5d);
    str::~str((str *)0x15fd6a);
  }
  detail::object_api<pybind11::handle>::attr(this_01,(char *)this_00);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (this_00,(module_ *)local_18);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x15feea);
  local_e2 = 1;
  std::__cxx11::string::~string(local_40);
  return (module_)in_RDI.super_handle.m_ptr;
}

Assistant:

module_ def_submodule(const char *name, const char *doc = nullptr) {
        std::string full_name = std::string(PyModule_GetName(m_ptr))
            + std::string(".") + std::string(name);
        auto result = reinterpret_borrow<module_>(PyImport_AddModule(full_name.c_str()));
        if (doc && options::show_user_defined_docstrings())
            result.attr("__doc__") = pybind11::str(doc);
        attr(name) = result;
        return result;
    }